

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_bit_decoder.cc
# Opt level: O1

bool __thiscall draco::RAnsBitDecoder::DecodeNextBit(RAnsBitDecoder *this)

{
  uint8_t uVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  uint32_t uVar6;
  
  uVar1 = this->prob_zero_;
  uVar2 = (this->ans_decoder_).state;
  if ((uVar2 < 0x1000) && (iVar5 = (this->ans_decoder_).buf_offset, 0 < iVar5)) {
    uVar4 = iVar5 - 1;
    (this->ans_decoder_).buf_offset = uVar4;
    (this->ans_decoder_).state = (uint)(this->ans_decoder_).buf[uVar4] | uVar2 << 8;
  }
  bVar3 = -uVar1;
  uVar2 = (this->ans_decoder_).state;
  uVar4 = uVar2 & 0xff;
  iVar5 = (uVar2 >> 8) * (uint)bVar3;
  uVar6 = iVar5 + uVar4;
  if (uVar4 >= bVar3) {
    uVar6 = (uVar2 - iVar5) - (uint)bVar3;
  }
  (this->ans_decoder_).state = uVar6;
  return uVar4 < bVar3;
}

Assistant:

bool RAnsBitDecoder::DecodeNextBit() {
  const uint8_t bit = rabs_read(&ans_decoder_, prob_zero_);
  return bit > 0;
}